

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitiveAssembler.hpp
# Opt level: O2

void rr::pa::TriangleStripAdjacency::
     exec<__gnu_cxx::__normal_iterator<rr::pa::TriangleAdjacency*,std::vector<rr::pa::TriangleAdjacency,std::allocator<rr::pa::TriangleAdjacency>>>>
               (__normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                outputIterator,VertexPacket **vertices,size_t numVertices,
               ProvokingVertex provokingConvention)

{
  undefined1 auVar1 [16];
  VertexPacket *pVVar2;
  VertexPacket *pVVar3;
  VertexPacket *pVVar4;
  VertexPacket *pVVar5;
  VertexPacket *pVVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  VertexPacket **ppVVar11;
  int iVar12;
  int *piVar13;
  VertexPacket **ppVVar14;
  ulong uVar15;
  VertexPacket **ppVVar16;
  VertexPacket **ppVVar17;
  VertexPacket **ppVVar18;
  VertexPacket **ppVVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  if (5 < numVertices) {
    if (7 < numVertices) {
      uVar9 = numVertices - 4 >> 1;
      pVVar2 = vertices[2];
      pVVar3 = vertices[6];
      iVar7 = (uint)(provokingConvention != PROVOKINGVERTEX_FIRST) * 4;
      pVVar4 = vertices[1];
      auVar1 = *(undefined1 (*) [16])(vertices + 3);
      (outputIterator._M_current)->v0 = *vertices;
      (outputIterator._M_current)->v1 = pVVar4;
      (outputIterator._M_current)->v2 = pVVar2;
      (outputIterator._M_current)->v3 = pVVar3;
      auVar21._0_8_ = auVar1._8_8_;
      auVar21._8_4_ = auVar1._0_4_;
      auVar21._12_4_ = auVar1._4_4_;
      (outputIterator._M_current)->v4 = (VertexPacket *)auVar21._0_8_;
      (outputIterator._M_current)->v5 = (VertexPacket *)auVar21._8_8_;
      (outputIterator._M_current)->provokingIndex = iVar7;
      iVar8 = (uint)(provokingConvention != PROVOKINGVERTEX_FIRST) * 2 + 2;
      piVar13 = &outputIterator._M_current[1].provokingIndex;
      uVar10 = uVar9 - 1;
      ppVVar14 = vertices + 8;
      for (uVar15 = 1; (2 - uVar9) + uVar15 != 1; uVar15 = uVar15 + 1) {
        if ((uVar15 & 1) == 0) {
          ppVVar16 = vertices + uVar15 * 2;
          ppVVar18 = vertices + uVar15 * 2 + 2;
          ppVVar11 = vertices + uVar15 * 2 + 6;
          ppVVar17 = vertices + uVar15 * 2 + 3;
          ppVVar19 = ppVVar16;
          iVar12 = iVar7;
        }
        else {
          ppVVar18 = ppVVar14 + -6;
          ppVVar16 = ppVVar14 + -4;
          ppVVar11 = ppVVar14 + -3;
          ppVVar17 = ppVVar14;
          ppVVar19 = ppVVar18;
          iVar12 = iVar8;
        }
        pVVar2 = *ppVVar17;
        pVVar3 = ppVVar19[-2];
        pVVar4 = ppVVar19[4];
        pVVar5 = *ppVVar11;
        pVVar6 = *ppVVar18;
        ((TriangleAdjacency *)(piVar13 + -0xc))->v0 = *ppVVar16;
        *(VertexPacket **)(piVar13 + -10) = pVVar3;
        *(VertexPacket **)(piVar13 + -8) = pVVar6;
        *(VertexPacket **)(piVar13 + -6) = pVVar5;
        *(VertexPacket **)(piVar13 + -4) = pVVar4;
        *(VertexPacket **)(piVar13 + -2) = pVVar2;
        *piVar13 = iVar12;
        piVar13 = piVar13 + 0xe;
        ppVVar14 = ppVVar14 + 2;
      }
      if ((uVar10 & 1) == 0) {
        pVVar2 = vertices[uVar10 * 2 + -2];
        pVVar3 = vertices[uVar10 * 2 + 2];
        pVVar4 = vertices[uVar10 * 2 + 3];
        auVar1 = *(undefined1 (*) [16])(vertices + uVar10 * 2 + 4);
        ((TriangleAdjacency *)(piVar13 + -0xc))->v0 = vertices[uVar10 * 2];
        *(VertexPacket **)(piVar13 + -10) = pVVar2;
        *(VertexPacket **)(piVar13 + -8) = pVVar3;
        auVar22._0_8_ = auVar1._8_8_;
        auVar22._8_4_ = auVar1._0_4_;
        auVar22._12_4_ = auVar1._4_4_;
        *(undefined1 (*) [16])(piVar13 + -6) = auVar22;
        *(VertexPacket **)(piVar13 + -2) = pVVar4;
        *piVar13 = iVar7;
      }
      else {
        pVVar2 = vertices[uVar10 * 2 + -2];
        pVVar3 = vertices[uVar10 * 2];
        pVVar4 = vertices[uVar10 * 2 + 5];
        pVVar5 = vertices[uVar10 * 2 + 3];
        pVVar6 = (vertices + uVar10 * 2 + 3)[1];
        ((TriangleAdjacency *)(piVar13 + -0xc))->v0 = vertices[uVar10 * 2 + 2];
        *(VertexPacket **)(piVar13 + -10) = pVVar2;
        *(VertexPacket **)(piVar13 + -8) = pVVar3;
        *(VertexPacket **)(piVar13 + -6) = pVVar5;
        *(VertexPacket **)(piVar13 + -4) = pVVar6;
        *(VertexPacket **)(piVar13 + -2) = pVVar4;
        *piVar13 = iVar8;
      }
      return;
    }
    pVVar2 = vertices[2];
    pVVar3 = vertices[3];
    pVVar4 = vertices[1];
    auVar1 = *(undefined1 (*) [16])(vertices + 4);
    (outputIterator._M_current)->v0 = *vertices;
    (outputIterator._M_current)->v1 = pVVar4;
    (outputIterator._M_current)->v2 = pVVar2;
    auVar20._0_8_ = auVar1._8_8_;
    auVar20._8_4_ = auVar1._0_4_;
    auVar20._12_4_ = auVar1._4_4_;
    (outputIterator._M_current)->v3 = (VertexPacket *)auVar20._0_8_;
    (outputIterator._M_current)->v4 = (VertexPacket *)auVar20._8_8_;
    (outputIterator._M_current)->v5 = pVVar3;
    (outputIterator._M_current)->provokingIndex =
         (uint)(provokingConvention != PROVOKINGVERTEX_FIRST) << 2;
  }
  return;
}

Assistant:

static void exec (Iterator outputIterator, VertexPacket* const* vertices, size_t numVertices, rr::ProvokingVertex provokingConvention)
	{
		if (numVertices < 6)
		{
		}
		else if (numVertices < 8)
		{
			*(outputIterator++) = TriangleAdjacency(vertices[0], vertices[1], vertices[2], vertices[5], vertices[4], vertices[3], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (4));
		}
		else
		{
			const size_t primitiveCount = getPrimitiveCount(numVertices);
			size_t i;

			// first
			*(outputIterator++) = TriangleAdjacency(vertices[0], vertices[1], vertices[2], vertices[6], vertices[4], vertices[3], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (4));

			// middle
			for (i = 1; i + 1 < primitiveCount; ++i)
			{
				// odd
				if (i % 2 == 1)
				{
					*(outputIterator++) = TriangleAdjacency(vertices[2*i+2], vertices[2*i-2], vertices[2*i+0], vertices[2*i+3], vertices[2*i+4], vertices[2*i+6], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (2) : (4));
				}
				// even
				else
				{
					*(outputIterator++) = TriangleAdjacency(vertices[2*i+0], vertices[2*i-2], vertices[2*i+2], vertices[2*i+6], vertices[2*i+4], vertices[2*i+3], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (4));
				}
			}

			// last

			// odd
			if (i % 2 == 1)
				*(outputIterator++) = TriangleAdjacency(vertices[2*i+2], vertices[2*i-2], vertices[2*i+0], vertices[2*i+3], vertices[2*i+4], vertices[2*i+5], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (2) : (4));
			// even
			else
				*(outputIterator++) = TriangleAdjacency(vertices[2*i+0], vertices[2*i-2], vertices[2*i+2], vertices[2*i+5], vertices[2*i+4], vertices[2*i+3], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (4));
		}
	}